

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBiDirectionalLSTMLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  uint64_t uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  BiDirectionalLSTMLayerParams *pBVar5;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *pRVar6;
  UniDirectionalLSTMLayerParams *pUVar7;
  LSTMWeightParams *lstmWeightParams;
  LSTMParams *pLVar8;
  string *psVar9;
  WeightParams *pWVar10;
  uint64_t uVar11;
  allocator local_1189;
  string local_1188;
  undefined1 local_1160 [32];
  Result local_1140;
  string local_1110;
  undefined1 local_10e8 [32];
  Result local_10c8;
  string local_1098;
  undefined1 local_1070 [32];
  Result local_1050;
  string local_1020;
  undefined1 local_ff8 [32];
  Result local_fd8;
  string local_fa8;
  undefined1 local_f80 [32];
  Result local_f60;
  string local_f30;
  undefined1 local_f08 [32];
  Result local_ee8;
  string local_eb8;
  undefined1 local_e90 [32];
  Result local_e70;
  string local_e40;
  undefined1 local_e18 [32];
  Result local_df8;
  string local_dc8;
  undefined1 local_da0 [32];
  Result local_d80;
  string local_d50;
  undefined1 local_d28 [32];
  Result local_d08;
  string local_cd8;
  undefined1 local_cb0 [32];
  Result local_c90;
  string local_c60;
  undefined1 local_c38 [32];
  Result local_c18;
  string local_be8;
  undefined1 local_bc0 [32];
  Result local_ba0;
  string local_b70;
  undefined1 local_b48 [32];
  Result local_b28;
  string local_af8;
  undefined1 local_ad0 [32];
  Result local_ab0;
  string local_a80;
  undefined1 local_a58 [32];
  Result local_a38;
  string local_a08;
  undefined1 local_9e0 [32];
  Result local_9c0;
  string local_990;
  undefined1 local_968 [32];
  Result local_948;
  string local_918;
  undefined1 local_8f0 [32];
  Result local_8d0;
  string local_8a0;
  undefined1 local_878 [32];
  Result local_858;
  string local_828;
  undefined1 local_800 [32];
  Result local_7e0;
  string local_7b0;
  undefined1 local_788 [32];
  Result local_768;
  string local_738;
  undefined1 local_710 [32];
  Result local_6f0;
  string local_6c0;
  undefined1 local_698 [32];
  Result local_678;
  string local_648;
  undefined1 local_620 [32];
  Result local_600;
  string local_5d0;
  undefined1 local_5a8 [32];
  Result local_588;
  string local_558;
  undefined1 local_530 [32];
  Result local_510;
  string local_4e0;
  undefined1 local_4b8 [32];
  Result local_498;
  string local_468;
  undefined1 local_440 [32];
  Result local_420;
  string local_3f0;
  undefined1 local_3c8 [32];
  Result local_3a8;
  LSTMWeightParams *weightParamsB;
  LSTMWeightParams *weightParamsF;
  uint64_t x;
  uint64_t h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  undefined1 local_2e0 [40];
  LSTMParams lstmParams;
  BiDirectionalLSTMLayerParams recurrent;
  undefined1 local_208 [40];
  Result local_1e0;
  ActivationParams *activation_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *__range1_1;
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_170;
  ActivationParams *activation;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *__range1;
  undefined1 local_148 [32];
  Result local_128;
  undefined1 local_f8 [32];
  Result local_d8;
  Result local_a8;
  undefined1 local_70 [48];
  Result_conflict r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r._32_8_ = layer;
  Result::Result((Result *)(local_70 + 0x28));
  validateInputCount((Result_conflict *)local_70,(NeuralNetworkLayer *)r._32_8_,1,5);
  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  Result::~Result((Result *)local_70);
  bVar3 = Result::good((Result *)(local_70 + 0x28));
  if (bVar3) {
    validateOutputCount((Result_conflict *)&local_a8,(NeuralNetworkLayer *)r._32_8_,5,5);
    Result::operator=((Result *)(local_70 + 0x28),&local_a8);
    Result::~Result(&local_a8);
  }
  bVar3 = Result::good((Result *)(local_70 + 0x28));
  if (!bVar3) {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
    local_d8.m_message._M_storage._M_storage[4] = '\x01';
    local_d8.m_message._M_storage._M_storage[5] = '\0';
    local_d8.m_message._M_storage._M_storage[6] = '\0';
    local_d8.m_message._M_storage._M_storage[7] = '\0';
    goto LAB_0040c781;
  }
  bVar3 = Result::good((Result *)(local_70 + 0x28));
  uVar2 = r._32_8_;
  if (!bVar3) {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
    local_d8.m_message._M_storage._M_storage[4] = '\x01';
    local_d8.m_message._M_storage._M_storage[5] = '\0';
    local_d8.m_message._M_storage._M_storage[6] = '\0';
    local_d8.m_message._M_storage._M_storage[7] = '\0';
    goto LAB_0040c781;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_f8,"BiDirectionalLSTM",
               (allocator *)((long)local_128.m_message._M_storage._M_storage + 7));
    validateInputOutputRankEquality
              ((Result_conflict *)(local_f8 + 0x20),(NeuralNetworkLayer *)uVar2,(string *)local_f8,
               &this->blobNameToRank);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_f8 + 0x20));
    Result::~Result((Result *)(local_f8 + 0x20));
    std::__cxx11::string::~string((string *)local_f8);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)local_128.m_message._M_storage._M_storage + 7));
    bVar3 = Result::good((Result *)(local_70 + 0x28));
    uVar2 = r._32_8_;
    if (!bVar3) {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
      local_d8.m_message._M_storage._M_storage[4] = '\x01';
      local_d8.m_message._M_storage._M_storage[5] = '\0';
      local_d8.m_message._M_storage._M_storage[6] = '\0';
      local_d8.m_message._M_storage._M_storage[7] = '\0';
      goto LAB_0040c781;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_148,"BiDirectionalLSTM",(allocator *)((long)&__range1 + 7));
    validateRankCount((Result_conflict *)(local_148 + 0x20),(NeuralNetworkLayer *)uVar2,
                      (string *)local_148,5,5,&this->blobNameToRank);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_148 + 0x20));
    Result::~Result((Result *)(local_148 + 0x20));
    std::__cxx11::string::~string((string *)local_148);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    bVar3 = Result::good((Result *)(local_70 + 0x28));
    if (!bVar3) {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
      local_d8.m_message._M_storage._M_storage[4] = '\x01';
      local_d8.m_message._M_storage._M_storage[5] = '\0';
      local_d8.m_message._M_storage._M_storage[6] = '\0';
      local_d8.m_message._M_storage._M_storage[7] = '\0';
      goto LAB_0040c781;
    }
  }
  pBVar5 = Specification::NeuralNetworkLayer::bidirectionallstm((NeuralNetworkLayer *)r._32_8_);
  pRVar6 = Specification::BiDirectionalLSTMLayerParams::activationsforwardlstm(pBVar5);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::begin
                     (pRVar6);
  activation = (ActivationParams *)
               google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::end
                         (pRVar6);
  while (bVar3 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator!=
                           (&__end1,(iterator *)&activation), bVar3) {
    local_170._M_storage =
         (uchar  [8])
         google::protobuf::internal::
         RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator*(&__end1);
    validateRecurrentActivationParams
              ((Result_conflict *)&__range1_1,(ActivationParams *)local_170._M_storage);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)&__range1_1);
    Result::~Result((Result *)&__range1_1);
    bVar3 = Result::good((Result *)(local_70 + 0x28));
    if (!bVar3) break;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::
    operator++(&__end1);
  }
  pBVar5 = Specification::NeuralNetworkLayer::bidirectionallstm((NeuralNetworkLayer *)r._32_8_);
  pRVar6 = Specification::BiDirectionalLSTMLayerParams::activationsbackwardlstm(pBVar5);
  __end1_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::begin
                       (pRVar6);
  activation_1 = (ActivationParams *)
                 google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::end
                           (pRVar6);
  while (bVar3 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator!=
                           (&__end1_1,(iterator *)&activation_1), bVar3) {
    local_1e0.m_message._M_storage._M_storage =
         (uchar  [8])
         google::protobuf::internal::
         RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator*(&__end1_1);
    validateRecurrentActivationParams
              ((Result_conflict *)(local_208 + 0x28),
               (ActivationParams *)local_1e0.m_message._M_storage._M_storage);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_208 + 0x28));
    Result::~Result((Result *)(local_208 + 0x28));
    bVar3 = Result::good((Result *)(local_70 + 0x28));
    if (!bVar3) break;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::
    operator++(&__end1_1);
  }
  pUVar7 = Specification::NeuralNetworkLayer::unidirectionallstm((NeuralNetworkLayer *)r._32_8_);
  lstmWeightParams = Specification::UniDirectionalLSTMLayerParams::weightparams(pUVar7);
  pUVar7 = Specification::NeuralNetworkLayer::unidirectionallstm((NeuralNetworkLayer *)r._32_8_);
  pLVar8 = Specification::UniDirectionalLSTMLayerParams::params(pUVar7);
  Specification::LSTMParams::LSTMParams((LSTMParams *)&recurrent._cached_size_,pLVar8);
  validateLSTMWeightParams
            ((Result_conflict *)local_208,lstmWeightParams,(LSTMParams *)&recurrent._cached_size_);
  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_208);
  Result::~Result((Result *)local_208);
  Specification::LSTMParams::~LSTMParams((LSTMParams *)&recurrent._cached_size_);
  bVar3 = Result::good((Result *)(local_70 + 0x28));
  if (!bVar3) {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
    local_d8.m_message._M_storage._M_storage[4] = '\x01';
    local_d8.m_message._M_storage._M_storage[5] = '\0';
    local_d8.m_message._M_storage._M_storage[6] = '\0';
    local_d8.m_message._M_storage._M_storage[7] = '\0';
    goto LAB_0040c781;
  }
  pBVar5 = Specification::NeuralNetworkLayer::bidirectionallstm((NeuralNetworkLayer *)r._32_8_);
  Specification::BiDirectionalLSTMLayerParams::BiDirectionalLSTMLayerParams
            ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_,pBVar5);
  pLVar8 = Specification::BiDirectionalLSTMLayerParams::params
                     ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_);
  Specification::LSTMParams::LSTMParams((LSTMParams *)(local_2e0 + 0x20),pLVar8);
  std::__cxx11::string::string((string *)local_2e0);
  iVar4 = Specification::BiDirectionalLSTMLayerParams::activationsforwardlstm_size
                    ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_);
  if (iVar4 == 3) {
    iVar4 = Specification::BiDirectionalLSTMLayerParams::activationsbackwardlstm_size
                      ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_);
    if (iVar4 == 3) {
      x = Specification::BiDirectionalLSTMLayerParams::outputvectorsize
                    ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_);
      weightParamsF =
           (LSTMWeightParams *)
           Specification::BiDirectionalLSTMLayerParams::inputvectorsize
                     ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_);
      weightParamsB =
           Specification::BiDirectionalLSTMLayerParams::weightparams
                     ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_,0);
      local_3a8.m_message._M_storage._M_storage =
           (uchar  [8])
           Specification::BiDirectionalLSTMLayerParams::weightparams
                     ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_,1);
      pWVar10 = Specification::LSTMWeightParams::inputgateweightmatrix(weightParamsB);
      uVar1 = x;
      uVar11 = x * (long)weightParamsF;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_3c8,"Bidirectional LSTM",
                 (allocator *)(local_3f0._M_storage._M_storage + 7));
      psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3f0,"forward input gate weight matrix",
                 (allocator *)((long)local_420.m_message._M_storage._M_storage + 7));
      validateGeneralWeightParams
                ((Result_conflict *)(local_3c8 + 0x20),pWVar10,uVar11,uVar1,(string *)local_3c8,
                 psVar9,&local_3f0);
      Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_3c8 + 0x20));
      Result::~Result((Result *)(local_3c8 + 0x20));
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)local_420.m_message._M_storage._M_storage + 7));
      std::__cxx11::string::~string((string *)local_3c8);
      std::allocator<char>::~allocator((allocator<char> *)(local_3f0._M_storage._M_storage + 7));
      bVar3 = Result::good((Result *)(local_70 + 0x28));
      if (bVar3) {
        pWVar10 = Specification::LSTMWeightParams::forgetgateweightmatrix(weightParamsB);
        uVar1 = x;
        uVar11 = x * (long)weightParamsF;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_440,"Bidirectional LSTM",
                   (allocator *)(local_468._M_storage._M_storage + 7));
        psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_468,"forward forget gate weight matrix",
                   (allocator *)((long)local_498.m_message._M_storage._M_storage + 7));
        validateGeneralWeightParams
                  ((Result_conflict *)(local_440 + 0x20),pWVar10,uVar11,uVar1,(string *)local_440,
                   psVar9,&local_468);
        Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_440 + 0x20));
        Result::~Result((Result *)(local_440 + 0x20));
        std::__cxx11::string::~string((string *)&local_468);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)local_498.m_message._M_storage._M_storage + 7));
        std::__cxx11::string::~string((string *)local_440);
        std::allocator<char>::~allocator((allocator<char> *)(local_468._M_storage._M_storage + 7));
        bVar3 = Result::good((Result *)(local_70 + 0x28));
        if (bVar3) {
          pWVar10 = Specification::LSTMWeightParams::blockinputweightmatrix(weightParamsB);
          uVar1 = x;
          uVar11 = x * (long)weightParamsF;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_4b8,"Bidirectional LSTM",
                     (allocator *)(local_4e0._M_storage._M_storage + 7));
          psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                             ((NeuralNetworkLayer *)r._32_8_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_4e0,"forward block input gate weight matrix",
                     (allocator *)((long)local_510.m_message._M_storage._M_storage + 7));
          validateGeneralWeightParams
                    ((Result_conflict *)(local_4b8 + 0x20),pWVar10,uVar11,uVar1,(string *)local_4b8,
                     psVar9,&local_4e0);
          Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_4b8 + 0x20));
          Result::~Result((Result *)(local_4b8 + 0x20));
          std::__cxx11::string::~string((string *)&local_4e0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)local_510.m_message._M_storage._M_storage + 7));
          std::__cxx11::string::~string((string *)local_4b8);
          std::allocator<char>::~allocator((allocator<char> *)(local_4e0._M_storage._M_storage + 7))
          ;
          bVar3 = Result::good((Result *)(local_70 + 0x28));
          if (bVar3) {
            pWVar10 = Specification::LSTMWeightParams::outputgateweightmatrix(weightParamsB);
            uVar1 = x;
            uVar11 = x * (long)weightParamsF;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_530,"Bidirectional LSTM",
                       (allocator *)(local_558._M_storage._M_storage + 7));
            psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                               ((NeuralNetworkLayer *)r._32_8_);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_558,"forward output gate weight matrix",
                       (allocator *)((long)local_588.m_message._M_storage._M_storage + 7));
            validateGeneralWeightParams
                      ((Result_conflict *)(local_530 + 0x20),pWVar10,uVar11,uVar1,
                       (string *)local_530,psVar9,&local_558);
            Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_530 + 0x20));
            Result::~Result((Result *)(local_530 + 0x20));
            std::__cxx11::string::~string((string *)&local_558);
            std::allocator<char>::~allocator
                      ((allocator<char> *)((long)local_588.m_message._M_storage._M_storage + 7));
            std::__cxx11::string::~string((string *)local_530);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(local_558._M_storage._M_storage + 7));
            bVar3 = Result::good((Result *)(local_70 + 0x28));
            if (bVar3) {
              pWVar10 = Specification::LSTMWeightParams::inputgaterecursionmatrix(weightParamsB);
              uVar1 = x;
              uVar11 = x * x;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)local_5a8,"Bidirectional LSTM",
                         (allocator *)(local_5d0._M_storage._M_storage + 7));
              psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                 ((NeuralNetworkLayer *)r._32_8_);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_5d0,"forward input gate recursion matrix",
                         (allocator *)((long)local_600.m_message._M_storage._M_storage + 7));
              validateGeneralWeightParams
                        ((Result_conflict *)(local_5a8 + 0x20),pWVar10,uVar11,uVar1,
                         (string *)local_5a8,psVar9,&local_5d0);
              Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_5a8 + 0x20));
              Result::~Result((Result *)(local_5a8 + 0x20));
              std::__cxx11::string::~string((string *)&local_5d0);
              std::allocator<char>::~allocator
                        ((allocator<char> *)((long)local_600.m_message._M_storage._M_storage + 7));
              std::__cxx11::string::~string((string *)local_5a8);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(local_5d0._M_storage._M_storage + 7));
              bVar3 = Result::good((Result *)(local_70 + 0x28));
              if (bVar3) {
                pWVar10 = Specification::LSTMWeightParams::forgetgaterecursionmatrix(weightParamsB);
                uVar1 = x;
                uVar11 = x * x;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)local_620,"Bidirectional LSTM",
                           (allocator *)(local_648._M_storage._M_storage + 7));
                psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                   ((NeuralNetworkLayer *)r._32_8_);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_648,"forward forget gate recursion matrix",
                           (allocator *)((long)local_678.m_message._M_storage._M_storage + 7));
                validateGeneralWeightParams
                          ((Result_conflict *)(local_620 + 0x20),pWVar10,uVar11,uVar1,
                           (string *)local_620,psVar9,&local_648);
                Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_620 + 0x20));
                Result::~Result((Result *)(local_620 + 0x20));
                std::__cxx11::string::~string((string *)&local_648);
                std::allocator<char>::~allocator
                          ((allocator<char> *)((long)local_678.m_message._M_storage._M_storage + 7))
                ;
                std::__cxx11::string::~string((string *)local_620);
                std::allocator<char>::~allocator
                          ((allocator<char> *)(local_648._M_storage._M_storage + 7));
                bVar3 = Result::good((Result *)(local_70 + 0x28));
                if (bVar3) {
                  pWVar10 = Specification::LSTMWeightParams::blockinputrecursionmatrix
                                      (weightParamsB);
                  uVar1 = x;
                  uVar11 = x * x;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)local_698,"Bidirectional LSTM",
                             (allocator *)(local_6c0._M_storage._M_storage + 7));
                  psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                     ((NeuralNetworkLayer *)r._32_8_);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_6c0,"forward block input gate recursion matrix",
                             (allocator *)((long)local_6f0.m_message._M_storage._M_storage + 7));
                  validateGeneralWeightParams
                            ((Result_conflict *)(local_698 + 0x20),pWVar10,uVar11,uVar1,
                             (string *)local_698,psVar9,&local_6c0);
                  Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_698 + 0x20));
                  Result::~Result((Result *)(local_698 + 0x20));
                  std::__cxx11::string::~string((string *)&local_6c0);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)local_6f0.m_message._M_storage._M_storage + 7));
                  std::__cxx11::string::~string((string *)local_698);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)(local_6c0._M_storage._M_storage + 7));
                  bVar3 = Result::good((Result *)(local_70 + 0x28));
                  if (bVar3) {
                    pWVar10 = Specification::LSTMWeightParams::outputgaterecursionmatrix
                                        (weightParamsB);
                    uVar1 = x;
                    uVar11 = x * x;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)local_710,"Bidirectional LSTM",
                               (allocator *)(local_738._M_storage._M_storage + 7));
                    psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                       ((NeuralNetworkLayer *)r._32_8_);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_738,"forward output gate recursion matrix",
                               (allocator *)((long)local_768.m_message._M_storage._M_storage + 7));
                    validateGeneralWeightParams
                              ((Result_conflict *)(local_710 + 0x20),pWVar10,uVar11,uVar1,
                               (string *)local_710,psVar9,&local_738);
                    Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_710 + 0x20));
                    Result::~Result((Result *)(local_710 + 0x20));
                    std::__cxx11::string::~string((string *)&local_738);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)
                               ((long)local_768.m_message._M_storage._M_storage + 7));
                    std::__cxx11::string::~string((string *)local_710);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)(local_738._M_storage._M_storage + 7));
                    bVar3 = Result::good((Result *)(local_70 + 0x28));
                    if (bVar3) {
                      pWVar10 = Specification::LSTMWeightParams::inputgateweightmatrix
                                          ((LSTMWeightParams *)
                                           local_3a8.m_message._M_storage._M_storage);
                      uVar1 = x;
                      uVar11 = x * (long)weightParamsF;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)local_788,"Bidirectional LSTM",
                                 (allocator *)(local_7b0._M_storage._M_storage + 7));
                      psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                         ((NeuralNetworkLayer *)r._32_8_);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)&local_7b0,"backward input gate weight matrix",
                                 (allocator *)((long)local_7e0.m_message._M_storage._M_storage + 7))
                      ;
                      validateGeneralWeightParams
                                ((Result_conflict *)(local_788 + 0x20),pWVar10,uVar11,uVar1,
                                 (string *)local_788,psVar9,&local_7b0);
                      Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_788 + 0x20));
                      Result::~Result((Result *)(local_788 + 0x20));
                      std::__cxx11::string::~string((string *)&local_7b0);
                      std::allocator<char>::~allocator
                                ((allocator<char> *)
                                 ((long)local_7e0.m_message._M_storage._M_storage + 7));
                      std::__cxx11::string::~string((string *)local_788);
                      std::allocator<char>::~allocator
                                ((allocator<char> *)(local_7b0._M_storage._M_storage + 7));
                      bVar3 = Result::good((Result *)(local_70 + 0x28));
                      if (bVar3) {
                        pWVar10 = Specification::LSTMWeightParams::forgetgateweightmatrix
                                            ((LSTMWeightParams *)
                                             local_3a8.m_message._M_storage._M_storage);
                        uVar1 = x;
                        uVar11 = x * (long)weightParamsF;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)local_800,"Bidirectional LSTM",
                                   (allocator *)(local_828._M_storage._M_storage + 7));
                        psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                           ((NeuralNetworkLayer *)r._32_8_);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_828,"backward forget gate weight matrix",
                                   (allocator *)
                                   ((long)local_858.m_message._M_storage._M_storage + 7));
                        validateGeneralWeightParams
                                  ((Result_conflict *)(local_800 + 0x20),pWVar10,uVar11,uVar1,
                                   (string *)local_800,psVar9,&local_828);
                        Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_800 + 0x20));
                        Result::~Result((Result *)(local_800 + 0x20));
                        std::__cxx11::string::~string((string *)&local_828);
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)
                                   ((long)local_858.m_message._M_storage._M_storage + 7));
                        std::__cxx11::string::~string((string *)local_800);
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)(local_828._M_storage._M_storage + 7));
                        bVar3 = Result::good((Result *)(local_70 + 0x28));
                        if (bVar3) {
                          pWVar10 = Specification::LSTMWeightParams::blockinputweightmatrix
                                              ((LSTMWeightParams *)
                                               local_3a8.m_message._M_storage._M_storage);
                          uVar1 = x;
                          uVar11 = x * (long)weightParamsF;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)local_878,"Bidirectional LSTM",
                                     (allocator *)(local_8a0._M_storage._M_storage + 7));
                          psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                             ((NeuralNetworkLayer *)r._32_8_);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)&local_8a0,"backward block input gate weight matrix",
                                     (allocator *)
                                     ((long)local_8d0.m_message._M_storage._M_storage + 7));
                          validateGeneralWeightParams
                                    ((Result_conflict *)(local_878 + 0x20),pWVar10,uVar11,uVar1,
                                     (string *)local_878,psVar9,&local_8a0);
                          Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_878 + 0x20)
                                           );
                          Result::~Result((Result *)(local_878 + 0x20));
                          std::__cxx11::string::~string((string *)&local_8a0);
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)
                                     ((long)local_8d0.m_message._M_storage._M_storage + 7));
                          std::__cxx11::string::~string((string *)local_878);
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)(local_8a0._M_storage._M_storage + 7));
                          bVar3 = Result::good((Result *)(local_70 + 0x28));
                          if (bVar3) {
                            pWVar10 = Specification::LSTMWeightParams::outputgateweightmatrix
                                                ((LSTMWeightParams *)
                                                 local_3a8.m_message._M_storage._M_storage);
                            uVar1 = x;
                            uVar11 = x * (long)weightParamsF;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)local_8f0,"Bidirectional LSTM",
                                       (allocator *)(local_918._M_storage._M_storage + 7));
                            psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                               ((NeuralNetworkLayer *)r._32_8_);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)&local_918,"backward output gate weight matrix",
                                       (allocator *)
                                       ((long)local_948.m_message._M_storage._M_storage + 7));
                            validateGeneralWeightParams
                                      ((Result_conflict *)(local_8f0 + 0x20),pWVar10,uVar11,uVar1,
                                       (string *)local_8f0,psVar9,&local_918);
                            Result::operator=((Result *)(local_70 + 0x28),
                                              (Result *)(local_8f0 + 0x20));
                            Result::~Result((Result *)(local_8f0 + 0x20));
                            std::__cxx11::string::~string((string *)&local_918);
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)
                                       ((long)local_948.m_message._M_storage._M_storage + 7));
                            std::__cxx11::string::~string((string *)local_8f0);
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)(local_918._M_storage._M_storage + 7));
                            bVar3 = Result::good((Result *)(local_70 + 0x28));
                            if (bVar3) {
                              pWVar10 = Specification::LSTMWeightParams::inputgaterecursionmatrix
                                                  ((LSTMWeightParams *)
                                                   local_3a8.m_message._M_storage._M_storage);
                              uVar1 = x;
                              uVar11 = x * x;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        ((string *)local_968,"Bidirectional LSTM",
                                         (allocator *)(local_990._M_storage._M_storage + 7));
                              psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                 ((NeuralNetworkLayer *)r._32_8_);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        ((string *)&local_990,"backward input gate recursion matrix"
                                         ,(allocator *)
                                          ((long)local_9c0.m_message._M_storage._M_storage + 7));
                              validateGeneralWeightParams
                                        ((Result_conflict *)(local_968 + 0x20),pWVar10,uVar11,uVar1,
                                         (string *)local_968,psVar9,&local_990);
                              Result::operator=((Result *)(local_70 + 0x28),
                                                (Result *)(local_968 + 0x20));
                              Result::~Result((Result *)(local_968 + 0x20));
                              std::__cxx11::string::~string((string *)&local_990);
                              std::allocator<char>::~allocator
                                        ((allocator<char> *)
                                         ((long)local_9c0.m_message._M_storage._M_storage + 7));
                              std::__cxx11::string::~string((string *)local_968);
                              std::allocator<char>::~allocator
                                        ((allocator<char> *)(local_990._M_storage._M_storage + 7));
                              bVar3 = Result::good((Result *)(local_70 + 0x28));
                              if (bVar3) {
                                pWVar10 = Specification::LSTMWeightParams::forgetgaterecursionmatrix
                                                    ((LSTMWeightParams *)
                                                     local_3a8.m_message._M_storage._M_storage);
                                uVar1 = x;
                                uVar11 = x * x;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          ((string *)local_9e0,"Bidirectional LSTM",
                                           (allocator *)(local_a08._M_storage._M_storage + 7));
                                psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                   ((NeuralNetworkLayer *)r._32_8_);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          ((string *)&local_a08,
                                           "backward forget gate recursion matrix",
                                           (allocator *)
                                           ((long)local_a38.m_message._M_storage._M_storage + 7));
                                validateGeneralWeightParams
                                          ((Result_conflict *)(local_9e0 + 0x20),pWVar10,uVar11,
                                           uVar1,(string *)local_9e0,psVar9,&local_a08);
                                Result::operator=((Result *)(local_70 + 0x28),
                                                  (Result *)(local_9e0 + 0x20));
                                Result::~Result((Result *)(local_9e0 + 0x20));
                                std::__cxx11::string::~string((string *)&local_a08);
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)
                                           ((long)local_a38.m_message._M_storage._M_storage + 7));
                                std::__cxx11::string::~string((string *)local_9e0);
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)(local_a08._M_storage._M_storage + 7))
                                ;
                                bVar3 = Result::good((Result *)(local_70 + 0x28));
                                if (bVar3) {
                                  pWVar10 = Specification::LSTMWeightParams::
                                            blockinputrecursionmatrix
                                                      ((LSTMWeightParams *)
                                                       local_3a8.m_message._M_storage._M_storage);
                                  uVar1 = x;
                                  uVar11 = x * x;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)local_a58,"Bidirectional LSTM",
                                             (allocator *)(local_a80._M_storage._M_storage + 7));
                                  psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                     ((NeuralNetworkLayer *)r._32_8_);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)&local_a80,
                                             "backward block input gate recursion matrix",
                                             (allocator *)
                                             ((long)local_ab0.m_message._M_storage._M_storage + 7));
                                  validateGeneralWeightParams
                                            ((Result_conflict *)(local_a58 + 0x20),pWVar10,uVar11,
                                             uVar1,(string *)local_a58,psVar9,&local_a80);
                                  Result::operator=((Result *)(local_70 + 0x28),
                                                    (Result *)(local_a58 + 0x20));
                                  Result::~Result((Result *)(local_a58 + 0x20));
                                  std::__cxx11::string::~string((string *)&local_a80);
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)
                                             ((long)local_ab0.m_message._M_storage._M_storage + 7));
                                  std::__cxx11::string::~string((string *)local_a58);
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)
                                             (local_a80._M_storage._M_storage + 7));
                                  bVar3 = Result::good((Result *)(local_70 + 0x28));
                                  if (bVar3) {
                                    pWVar10 = Specification::LSTMWeightParams::
                                              outputgaterecursionmatrix
                                                        ((LSTMWeightParams *)
                                                         local_3a8.m_message._M_storage._M_storage);
                                    uVar1 = x;
                                    uVar11 = x * x;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)local_ad0,"Bidirectional LSTM",
                                               (allocator *)(local_af8._M_storage._M_storage + 7));
                                    psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                       ((NeuralNetworkLayer *)r._32_8_);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)&local_af8,
                                               "backward output gate recursion matrix",
                                               (allocator *)
                                               ((long)local_b28.m_message._M_storage._M_storage + 7)
                                              );
                                    validateGeneralWeightParams
                                              ((Result_conflict *)(local_ad0 + 0x20),pWVar10,uVar11,
                                               uVar1,(string *)local_ad0,psVar9,&local_af8);
                                    Result::operator=((Result *)(local_70 + 0x28),
                                                      (Result *)(local_ad0 + 0x20));
                                    Result::~Result((Result *)(local_ad0 + 0x20));
                                    std::__cxx11::string::~string((string *)&local_af8);
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)
                                               ((long)local_b28.m_message._M_storage._M_storage + 7)
                                              );
                                    std::__cxx11::string::~string((string *)local_ad0);
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)
                                               (local_af8._M_storage._M_storage + 7));
                                    bVar3 = Result::good((Result *)(local_70 + 0x28));
                                    if (bVar3) {
                                      pLVar8 = Specification::BiDirectionalLSTMLayerParams::params
                                                         ((BiDirectionalLSTMLayerParams *)
                                                          &lstmParams.coupledinputandforgetgate_);
                                      bVar3 = Specification::LSTMParams::hasbiasvectors(pLVar8);
                                      if (bVar3) {
                                        pWVar10 = Specification::LSTMWeightParams::
                                                  inputgatebiasvector(weightParamsB);
                                        uVar1 = x;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string
                                                  ((string *)local_b48,"Bidirectional LSTM",
                                                   (allocator *)
                                                   (local_b70._M_storage._M_storage + 7));
                                        psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                                           ((NeuralNetworkLayer *)r._32_8_);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string
                                                  ((string *)&local_b70,
                                                   "forward input gate bias vector",
                                                   (allocator *)
                                                   ((long)local_ba0.m_message._M_storage._M_storage
                                                   + 7));
                                        validateGeneralWeightParams
                                                  ((Result_conflict *)(local_b48 + 0x20),pWVar10,
                                                   uVar1,1,(string *)local_b48,psVar9,&local_b70);
                                        Result::operator=((Result *)(local_70 + 0x28),
                                                          (Result *)(local_b48 + 0x20));
                                        Result::~Result((Result *)(local_b48 + 0x20));
                                        std::__cxx11::string::~string((string *)&local_b70);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)
                                                   ((long)local_ba0.m_message._M_storage._M_storage
                                                   + 7));
                                        std::__cxx11::string::~string((string *)local_b48);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)
                                                   (local_b70._M_storage._M_storage + 7));
                                        bVar3 = Result::good((Result *)(local_70 + 0x28));
                                        if (bVar3) {
                                          pWVar10 = Specification::LSTMWeightParams::
                                                    forgetgatebiasvector(weightParamsB);
                                          uVar1 = x;
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string
                                                    ((string *)local_bc0,"Bidirectional LSTM",
                                                     (allocator *)
                                                     (local_be8._M_storage._M_storage + 7));
                                          psVar9 = Specification::NeuralNetworkLayer::
                                                   name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string
                                                    ((string *)&local_be8,
                                                     "forward forget gate bias vector",
                                                     (allocator *)
                                                     ((long)local_c18.m_message._M_storage.
                                                            _M_storage + 7));
                                          validateGeneralWeightParams
                                                    ((Result_conflict *)(local_bc0 + 0x20),pWVar10,
                                                     uVar1,1,(string *)local_bc0,psVar9,&local_be8);
                                          Result::operator=((Result *)(local_70 + 0x28),
                                                            (Result *)(local_bc0 + 0x20));
                                          Result::~Result((Result *)(local_bc0 + 0x20));
                                          std::__cxx11::string::~string((string *)&local_be8);
                                          std::allocator<char>::~allocator
                                                    ((allocator<char> *)
                                                     ((long)local_c18.m_message._M_storage.
                                                            _M_storage + 7));
                                          std::__cxx11::string::~string((string *)local_bc0);
                                          std::allocator<char>::~allocator
                                                    ((allocator<char> *)
                                                     (local_be8._M_storage._M_storage + 7));
                                          bVar3 = Result::good((Result *)(local_70 + 0x28));
                                          if (bVar3) {
                                            pWVar10 = Specification::LSTMWeightParams::
                                                      blockinputbiasvector(weightParamsB);
                                            uVar1 = x;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      ((string *)local_c38,"Bidirectional LSTM",
                                                       (allocator *)
                                                       (local_c60._M_storage._M_storage + 7));
                                            psVar9 = Specification::NeuralNetworkLayer::
                                                     name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_)
                                            ;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      ((string *)&local_c60,
                                                       "forward block input bias vector",
                                                       (allocator *)
                                                       ((long)local_c90.m_message._M_storage.
                                                              _M_storage + 7));
                                            validateGeneralWeightParams
                                                      ((Result_conflict *)(local_c38 + 0x20),pWVar10
                                                       ,uVar1,1,(string *)local_c38,psVar9,
                                                       &local_c60);
                                            Result::operator=((Result *)(local_70 + 0x28),
                                                              (Result *)(local_c38 + 0x20));
                                            Result::~Result((Result *)(local_c38 + 0x20));
                                            std::__cxx11::string::~string((string *)&local_c60);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)
                                                       ((long)local_c90.m_message._M_storage.
                                                              _M_storage + 7));
                                            std::__cxx11::string::~string((string *)local_c38);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)
                                                       (local_c60._M_storage._M_storage + 7));
                                            bVar3 = Result::good((Result *)(local_70 + 0x28));
                                            if (bVar3) {
                                              pWVar10 = Specification::LSTMWeightParams::
                                                        outputgatebiasvector(weightParamsB);
                                              uVar1 = x;
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string
                                                        ((string *)local_cb0,"Bidirectional LSTM",
                                                         (allocator *)
                                                         (local_cd8._M_storage._M_storage + 7));
                                              psVar9 = Specification::NeuralNetworkLayer::
                                                       name_abi_cxx11_((NeuralNetworkLayer *)
                                                                       r._32_8_);
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string
                                                        ((string *)&local_cd8,
                                                         "forward output gate bias vector",
                                                         (allocator *)
                                                         ((long)local_d08.m_message._M_storage.
                                                                _M_storage + 7));
                                              validateGeneralWeightParams
                                                        ((Result_conflict *)(local_cb0 + 0x20),
                                                         pWVar10,uVar1,1,(string *)local_cb0,psVar9,
                                                         &local_cd8);
                                              Result::operator=((Result *)(local_70 + 0x28),
                                                                (Result *)(local_cb0 + 0x20));
                                              Result::~Result((Result *)(local_cb0 + 0x20));
                                              std::__cxx11::string::~string((string *)&local_cd8);
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)
                                                         ((long)local_d08.m_message._M_storage.
                                                                _M_storage + 7));
                                              std::__cxx11::string::~string((string *)local_cb0);
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)
                                                         (local_cd8._M_storage._M_storage + 7));
                                              bVar3 = Result::good((Result *)(local_70 + 0x28));
                                              if (bVar3) {
                                                pWVar10 = Specification::LSTMWeightParams::
                                                          inputgatebiasvector((LSTMWeightParams *)
                                                                              local_3a8.m_message.
                                                                              _M_storage._M_storage)
                                                ;
                                                uVar1 = x;
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string
                                                          ((string *)local_d28,"Bidirectional LSTM",
                                                           (allocator *)
                                                           (local_d50._M_storage._M_storage + 7));
                                                psVar9 = Specification::NeuralNetworkLayer::
                                                         name_abi_cxx11_((NeuralNetworkLayer *)
                                                                         r._32_8_);
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string
                                                          ((string *)&local_d50,
                                                           "backward input gate bias vector",
                                                           (allocator *)
                                                           ((long)local_d80.m_message._M_storage.
                                                                  _M_storage + 7));
                                                validateGeneralWeightParams
                                                          ((Result_conflict *)(local_d28 + 0x20),
                                                           pWVar10,uVar1,1,(string *)local_d28,
                                                           psVar9,&local_d50);
                                                Result::operator=((Result *)(local_70 + 0x28),
                                                                  (Result *)(local_d28 + 0x20));
                                                Result::~Result((Result *)(local_d28 + 0x20));
                                                std::__cxx11::string::~string((string *)&local_d50);
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)
                                                           ((long)local_d80.m_message._M_storage.
                                                                  _M_storage + 7));
                                                std::__cxx11::string::~string((string *)local_d28);
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)
                                                           (local_d50._M_storage._M_storage + 7));
                                                bVar3 = Result::good((Result *)(local_70 + 0x28));
                                                if (bVar3) {
                                                  pWVar10 = Specification::LSTMWeightParams::
                                                            forgetgatebiasvector
                                                                      ((LSTMWeightParams *)
                                                                       local_3a8.m_message.
                                                                       _M_storage._M_storage);
                                                  uVar1 = x;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string
                                                            ((string *)local_da0,
                                                             "Bidirectional LSTM",
                                                             (allocator *)
                                                             (local_dc8._M_storage._M_storage + 7));
                                                  psVar9 = Specification::NeuralNetworkLayer::
                                                           name_abi_cxx11_((NeuralNetworkLayer *)
                                                                           r._32_8_);
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string
                                                            ((string *)&local_dc8,
                                                             "backward forget gate bias vector",
                                                             (allocator *)
                                                             ((long)local_df8.m_message._M_storage.
                                                                    _M_storage + 7));
                                                  validateGeneralWeightParams
                                                            ((Result_conflict *)(local_da0 + 0x20),
                                                             pWVar10,uVar1,1,(string *)local_da0,
                                                             psVar9,&local_dc8);
                                                  Result::operator=((Result *)(local_70 + 0x28),
                                                                    (Result *)(local_da0 + 0x20));
                                                  Result::~Result((Result *)(local_da0 + 0x20));
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_dc8);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             ((long)local_df8.m_message._M_storage.
                                                                    _M_storage + 7));
                                                  std::__cxx11::string::~string((string *)local_da0)
                                                  ;
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             (local_dc8._M_storage._M_storage + 7));
                                                  bVar3 = Result::good((Result *)(local_70 + 0x28));
                                                  if (bVar3) {
                                                    pWVar10 = Specification::LSTMWeightParams::
                                                              blockinputbiasvector
                                                                        ((LSTMWeightParams *)
                                                                         local_3a8.m_message.
                                                                         _M_storage._M_storage);
                                                    uVar1 = x;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              ((string *)local_e18,
                                                               "Bidirectional LSTM",
                                                               (allocator *)
                                                               (local_e40._M_storage._M_storage + 7)
                                                              );
                                                    psVar9 = Specification::NeuralNetworkLayer::
                                                             name_abi_cxx11_((NeuralNetworkLayer *)
                                                                             r._32_8_);
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              ((string *)&local_e40,
                                                               "backward block input bias vector",
                                                               (allocator *)
                                                               ((long)local_e70.m_message._M_storage
                                                                      ._M_storage + 7));
                                                    validateGeneralWeightParams
                                                              ((Result_conflict *)(local_e18 + 0x20)
                                                               ,pWVar10,uVar1,1,(string *)local_e18,
                                                               psVar9,&local_e40);
                                                    Result::operator=((Result *)(local_70 + 0x28),
                                                                      (Result *)(local_e18 + 0x20));
                                                    Result::~Result((Result *)(local_e18 + 0x20));
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_e40);
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)
                                                               ((long)local_e70.m_message._M_storage
                                                                      ._M_storage + 7));
                                                    std::__cxx11::string::~string
                                                              ((string *)local_e18);
                                                    std::allocator<char>::~allocator
                                                              ((allocator<char> *)
                                                               (local_e40._M_storage._M_storage + 7)
                                                              );
                                                    bVar3 = Result::good((Result *)(local_70 + 0x28)
                                                                        );
                                                    if (bVar3) {
                                                      pWVar10 = Specification::LSTMWeightParams::
                                                                outputgatebiasvector
                                                                          ((LSTMWeightParams *)
                                                                           local_3a8.m_message.
                                                                           _M_storage._M_storage);
                                                      uVar1 = x;
                                                      std::allocator<char>::allocator();
                                                      std::__cxx11::string::string
                                                                ((string *)local_e90,
                                                                 "Bidirectional LSTM",
                                                                 (allocator *)
                                                                 (local_eb8._M_storage._M_storage +
                                                                 7));
                                                      psVar9 = Specification::NeuralNetworkLayer::
                                                               name_abi_cxx11_((NeuralNetworkLayer *
                                                                               )r._32_8_);
                                                      std::allocator<char>::allocator();
                                                      std::__cxx11::string::string
                                                                ((string *)&local_eb8,
                                                                 "backward output gate bias vector",
                                                                 (allocator *)
                                                                 ((long)local_ee8.m_message.
                                                                        _M_storage._M_storage + 7));
                                                      validateGeneralWeightParams
                                                                ((Result_conflict *)
                                                                 (local_e90 + 0x20),pWVar10,uVar1,1,
                                                                 (string *)local_e90,psVar9,
                                                                 &local_eb8);
                                                      Result::operator=((Result *)(local_70 + 0x28),
                                                                        (Result *)(local_e90 + 0x20)
                                                                       );
                                                      Result::~Result((Result *)(local_e90 + 0x20));
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_eb8);
                                                      std::allocator<char>::~allocator
                                                                ((allocator<char> *)
                                                                 ((long)local_ee8.m_message.
                                                                        _M_storage._M_storage + 7));
                                                      std::__cxx11::string::~string
                                                                ((string *)local_e90);
                                                      std::allocator<char>::~allocator
                                                                ((allocator<char> *)
                                                                 (local_eb8._M_storage._M_storage +
                                                                 7));
                                                      bVar3 = Result::good((Result *)
                                                                           (local_70 + 0x28));
                                                      if (bVar3) goto LAB_0040bbda;
                                                      Result::Result((Result *)
                                                                     __return_storage_ptr__,
                                                                     (Result *)(local_70 + 0x28));
                                                    }
                                                    else {
                                                      Result::Result((Result *)
                                                                     __return_storage_ptr__,
                                                                     (Result *)(local_70 + 0x28));
                                                    }
                                                  }
                                                  else {
                                                    Result::Result((Result *)__return_storage_ptr__,
                                                                   (Result *)(local_70 + 0x28));
                                                  }
                                                }
                                                else {
                                                  Result::Result((Result *)__return_storage_ptr__,
                                                                 (Result *)(local_70 + 0x28));
                                                }
                                              }
                                              else {
                                                Result::Result((Result *)__return_storage_ptr__,
                                                               (Result *)(local_70 + 0x28));
                                              }
                                            }
                                            else {
                                              Result::Result((Result *)__return_storage_ptr__,
                                                             (Result *)(local_70 + 0x28));
                                            }
                                          }
                                          else {
                                            Result::Result((Result *)__return_storage_ptr__,
                                                           (Result *)(local_70 + 0x28));
                                          }
                                        }
                                        else {
                                          Result::Result((Result *)__return_storage_ptr__,
                                                         (Result *)(local_70 + 0x28));
                                        }
                                      }
                                      else {
LAB_0040bbda:
                                        pLVar8 = Specification::BiDirectionalLSTMLayerParams::params
                                                           ((BiDirectionalLSTMLayerParams *)
                                                            &lstmParams.coupledinputandforgetgate_);
                                        bVar3 = Specification::LSTMParams::haspeepholevectors
                                                          (pLVar8);
                                        if (bVar3) {
                                          pWVar10 = Specification::LSTMWeightParams::
                                                    inputgatepeepholevector(weightParamsB);
                                          uVar1 = x;
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string
                                                    ((string *)local_f08,"Bidirectional LSTM",
                                                     (allocator *)
                                                     (local_f30._M_storage._M_storage + 7));
                                          psVar9 = Specification::NeuralNetworkLayer::
                                                   name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string
                                                    ((string *)&local_f30,
                                                     "forward input gate peephole vector",
                                                     (allocator *)
                                                     ((long)local_f60.m_message._M_storage.
                                                            _M_storage + 7));
                                          validateGeneralWeightParams
                                                    ((Result_conflict *)(local_f08 + 0x20),pWVar10,
                                                     uVar1,1,(string *)local_f08,psVar9,&local_f30);
                                          Result::operator=((Result *)(local_70 + 0x28),
                                                            (Result *)(local_f08 + 0x20));
                                          Result::~Result((Result *)(local_f08 + 0x20));
                                          std::__cxx11::string::~string((string *)&local_f30);
                                          std::allocator<char>::~allocator
                                                    ((allocator<char> *)
                                                     ((long)local_f60.m_message._M_storage.
                                                            _M_storage + 7));
                                          std::__cxx11::string::~string((string *)local_f08);
                                          std::allocator<char>::~allocator
                                                    ((allocator<char> *)
                                                     (local_f30._M_storage._M_storage + 7));
                                          bVar3 = Result::good((Result *)(local_70 + 0x28));
                                          if (bVar3) {
                                            pWVar10 = Specification::LSTMWeightParams::
                                                      forgetgatepeepholevector(weightParamsB);
                                            uVar1 = x;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      ((string *)local_f80,"Bidirectional LSTM",
                                                       (allocator *)
                                                       (local_fa8._M_storage._M_storage + 7));
                                            psVar9 = Specification::NeuralNetworkLayer::
                                                     name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_)
                                            ;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      ((string *)&local_fa8,
                                                       "forward forget gate peephole vector",
                                                       (allocator *)
                                                       ((long)local_fd8.m_message._M_storage.
                                                              _M_storage + 7));
                                            validateGeneralWeightParams
                                                      ((Result_conflict *)(local_f80 + 0x20),pWVar10
                                                       ,uVar1,1,(string *)local_f80,psVar9,
                                                       &local_fa8);
                                            Result::operator=((Result *)(local_70 + 0x28),
                                                              (Result *)(local_f80 + 0x20));
                                            Result::~Result((Result *)(local_f80 + 0x20));
                                            std::__cxx11::string::~string((string *)&local_fa8);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)
                                                       ((long)local_fd8.m_message._M_storage.
                                                              _M_storage + 7));
                                            std::__cxx11::string::~string((string *)local_f80);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)
                                                       (local_fa8._M_storage._M_storage + 7));
                                            bVar3 = Result::good((Result *)(local_70 + 0x28));
                                            if (bVar3) {
                                              pWVar10 = Specification::LSTMWeightParams::
                                                        outputgatepeepholevector(weightParamsB);
                                              uVar1 = x;
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string
                                                        ((string *)local_ff8,"Bidirectional LSTM",
                                                         (allocator *)
                                                         (local_1020._M_storage._M_storage + 7));
                                              psVar9 = Specification::NeuralNetworkLayer::
                                                       name_abi_cxx11_((NeuralNetworkLayer *)
                                                                       r._32_8_);
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string
                                                        ((string *)&local_1020,
                                                         "forward output gate peephole vector",
                                                         (allocator *)
                                                         ((long)local_1050.m_message._M_storage.
                                                                _M_storage + 7));
                                              validateGeneralWeightParams
                                                        ((Result_conflict *)(local_ff8 + 0x20),
                                                         pWVar10,uVar1,1,(string *)local_ff8,psVar9,
                                                         &local_1020);
                                              Result::operator=((Result *)(local_70 + 0x28),
                                                                (Result *)(local_ff8 + 0x20));
                                              Result::~Result((Result *)(local_ff8 + 0x20));
                                              std::__cxx11::string::~string((string *)&local_1020);
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)
                                                         ((long)local_1050.m_message._M_storage.
                                                                _M_storage + 7));
                                              std::__cxx11::string::~string((string *)local_ff8);
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)
                                                         (local_1020._M_storage._M_storage + 7));
                                              bVar3 = Result::good((Result *)(local_70 + 0x28));
                                              if (bVar3) {
                                                pWVar10 = Specification::LSTMWeightParams::
                                                          inputgatepeepholevector
                                                                    ((LSTMWeightParams *)
                                                                     local_3a8.m_message._M_storage.
                                                                     _M_storage);
                                                uVar1 = x;
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string
                                                          ((string *)local_1070,"Bidirectional LSTM"
                                                           ,(allocator *)
                                                            (local_1098._M_storage._M_storage + 7));
                                                psVar9 = Specification::NeuralNetworkLayer::
                                                         name_abi_cxx11_((NeuralNetworkLayer *)
                                                                         r._32_8_);
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string
                                                          ((string *)&local_1098,
                                                           "backward input gate peephole vector",
                                                           (allocator *)
                                                           ((long)local_10c8.m_message._M_storage.
                                                                  _M_storage + 7));
                                                validateGeneralWeightParams
                                                          ((Result_conflict *)(local_1070 + 0x20),
                                                           pWVar10,uVar1,1,(string *)local_1070,
                                                           psVar9,&local_1098);
                                                Result::operator=((Result *)(local_70 + 0x28),
                                                                  (Result *)(local_1070 + 0x20));
                                                Result::~Result((Result *)(local_1070 + 0x20));
                                                std::__cxx11::string::~string((string *)&local_1098)
                                                ;
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)
                                                           ((long)local_10c8.m_message._M_storage.
                                                                  _M_storage + 7));
                                                std::__cxx11::string::~string((string *)local_1070);
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)
                                                           (local_1098._M_storage._M_storage + 7));
                                                bVar3 = Result::good((Result *)(local_70 + 0x28));
                                                if (bVar3) {
                                                  pWVar10 = Specification::LSTMWeightParams::
                                                            forgetgatepeepholevector
                                                                      ((LSTMWeightParams *)
                                                                       local_3a8.m_message.
                                                                       _M_storage._M_storage);
                                                  uVar1 = x;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string
                                                            ((string *)local_10e8,
                                                             "Bidirectional LSTM",
                                                             (allocator *)
                                                             (local_1110._M_storage._M_storage + 7))
                                                  ;
                                                  psVar9 = Specification::NeuralNetworkLayer::
                                                           name_abi_cxx11_((NeuralNetworkLayer *)
                                                                           r._32_8_);
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1110,
                                                             "backward forget gate peephole vector",
                                                             (allocator *)
                                                             ((long)local_1140.m_message._M_storage.
                                                                    _M_storage + 7));
                                                  validateGeneralWeightParams
                                                            ((Result_conflict *)(local_10e8 + 0x20),
                                                             pWVar10,uVar1,1,(string *)local_10e8,
                                                             psVar9,&local_1110);
                                                  Result::operator=((Result *)(local_70 + 0x28),
                                                                    (Result *)(local_10e8 + 0x20));
                                                  Result::~Result((Result *)(local_10e8 + 0x20));
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1110);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             ((long)local_1140.m_message._M_storage.
                                                                    _M_storage + 7));
                                                  std::__cxx11::string::~string
                                                            ((string *)local_10e8);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             (local_1110._M_storage._M_storage + 7))
                                                  ;
                                                  bVar3 = Result::good((Result *)(local_70 + 0x28));
                                                  if (bVar3) {
                                                    pWVar10 = Specification::LSTMWeightParams::
                                                              outputgatepeepholevector
                                                                        ((LSTMWeightParams *)
                                                                         local_3a8.m_message.
                                                                         _M_storage._M_storage);
                                                    uVar1 = x;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              ((string *)local_1160,
                                                               "Bidirectional LSTM",
                                                               (allocator *)
                                                               (local_1188._M_storage._M_storage + 7
                                                               ));
                                                    psVar9 = Specification::NeuralNetworkLayer::
                                                             name_abi_cxx11_((NeuralNetworkLayer *)
                                                                             r._32_8_);
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              ((string *)&local_1188,
                                                                                                                              
                                                  "backward output gate peephole vector",&local_1189
                                                  );
                                                  validateGeneralWeightParams
                                                            ((Result_conflict *)(local_1160 + 0x20),
                                                             pWVar10,uVar1,1,(string *)local_1160,
                                                             psVar9,&local_1188);
                                                  Result::operator=((Result *)(local_70 + 0x28),
                                                                    (Result *)(local_1160 + 0x20));
                                                  Result::~Result((Result *)(local_1160 + 0x20));
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1188);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_1189);
                                                  std::__cxx11::string::~string
                                                            ((string *)local_1160);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             (local_1188._M_storage._M_storage + 7))
                                                  ;
                                                  bVar3 = Result::good((Result *)(local_70 + 0x28));
                                                  if (bVar3) goto LAB_0040c71b;
                                                  Result::Result((Result *)__return_storage_ptr__,
                                                                 (Result *)(local_70 + 0x28));
                                                  }
                                                  else {
                                                    Result::Result((Result *)__return_storage_ptr__,
                                                                   (Result *)(local_70 + 0x28));
                                                  }
                                                }
                                                else {
                                                  Result::Result((Result *)__return_storage_ptr__,
                                                                 (Result *)(local_70 + 0x28));
                                                }
                                              }
                                              else {
                                                Result::Result((Result *)__return_storage_ptr__,
                                                               (Result *)(local_70 + 0x28));
                                              }
                                            }
                                            else {
                                              Result::Result((Result *)__return_storage_ptr__,
                                                             (Result *)(local_70 + 0x28));
                                            }
                                          }
                                          else {
                                            Result::Result((Result *)__return_storage_ptr__,
                                                           (Result *)(local_70 + 0x28));
                                          }
                                        }
                                        else {
LAB_0040c71b:
                                          Result::Result((Result *)__return_storage_ptr__,
                                                         (Result *)(local_70 + 0x28));
                                        }
                                      }
                                    }
                                    else {
                                      Result::Result((Result *)__return_storage_ptr__,
                                                     (Result *)(local_70 + 0x28));
                                    }
                                  }
                                  else {
                                    Result::Result((Result *)__return_storage_ptr__,
                                                   (Result *)(local_70 + 0x28));
                                  }
                                }
                                else {
                                  Result::Result((Result *)__return_storage_ptr__,
                                                 (Result *)(local_70 + 0x28));
                                }
                              }
                              else {
                                Result::Result((Result *)__return_storage_ptr__,
                                               (Result *)(local_70 + 0x28));
                              }
                            }
                            else {
                              Result::Result((Result *)__return_storage_ptr__,
                                             (Result *)(local_70 + 0x28));
                            }
                          }
                          else {
                            Result::Result((Result *)__return_storage_ptr__,
                                           (Result *)(local_70 + 0x28));
                          }
                        }
                        else {
                          Result::Result((Result *)__return_storage_ptr__,
                                         (Result *)(local_70 + 0x28));
                        }
                      }
                      else {
                        Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28))
                        ;
                      }
                    }
                    else {
                      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                    }
                  }
                  else {
                    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                  }
                }
                else {
                  Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
                }
              }
              else {
                Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
              }
            }
            else {
              Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
            }
          }
          else {
            Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
          }
        }
        else {
          Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
        }
      }
      else {
        Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
      }
    }
    else {
      psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,
                     "Bidirectional LSTM layer:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar9);
      std::operator+(&local_340,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,
                     " backward lstm must provide 3 activations");
      std::__cxx11::string::operator=((string *)local_2e0,(string *)&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&h);
      Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_2e0);
    }
  }
  else {
    psVar9 = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
    std::operator+(&local_320,"Bidirectional LSTM layer:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar9);
    std::operator+(&local_300,&local_320," forward lstm must provide 3 activations");
    std::__cxx11::string::operator=((string *)local_2e0,(string *)&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_2e0);
  }
  local_d8.m_message._M_storage._M_storage[4] = '\x01';
  local_d8.m_message._M_storage._M_storage[5] = '\0';
  local_d8.m_message._M_storage._M_storage[6] = '\0';
  local_d8.m_message._M_storage._M_storage[7] = '\0';
  std::__cxx11::string::~string((string *)local_2e0);
  Specification::LSTMParams::~LSTMParams((LSTMParams *)(local_2e0 + 0x20));
  Specification::BiDirectionalLSTMLayerParams::~BiDirectionalLSTMLayerParams
            ((BiDirectionalLSTMLayerParams *)&lstmParams.coupledinputandforgetgate_);
LAB_0040c781:
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBiDirectionalLSTMLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    // Must specify hidden states
    r = validateInputCount(layer, 1, 5);
    if (r.good()) {
        r = validateOutputCount(layer, 5, 5);
    }
    if (!r.good()) {
        return r;
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "BiDirectionalLSTM", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "BiDirectionalLSTM", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    for (const auto& activation : layer.bidirectionallstm().activationsforwardlstm()) {
        r = validateRecurrentActivationParams(activation);
        if (!r.good()) {
            break;
        }
    }
    for (const auto& activation : layer.bidirectionallstm().activationsbackwardlstm()) {
        r = validateRecurrentActivationParams(activation);
        if (!r.good()) {
            break;
        }
    }

    // Validate common LSTM params and ensure that all weight field types are consistent
    r = validateLSTMWeightParams(layer.unidirectionallstm().weightparams(), layer.unidirectionallstm().params());
    if (!r.good()) {
        return r;
    }

    Specification::BiDirectionalLSTMLayerParams recurrent = layer.bidirectionallstm();
    Specification::LSTMParams lstmParams = recurrent.params();
    std::string err;

    if (recurrent.activationsforwardlstm_size() != 3) {
        err = std::string("Bidirectional LSTM layer:" + layer.name() + " forward lstm must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (recurrent.activationsbackwardlstm_size() != 3){
        err = std::string("Bidirectional LSTM layer:" + layer.name() + " backward lstm must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Verify weights and biases sizes
    uint64_t h = recurrent.outputvectorsize();
    uint64_t x = recurrent.inputvectorsize();
    const Specification::LSTMWeightParams& weightParamsF = recurrent.weightparams(0);
    const Specification::LSTMWeightParams& weightParamsB = recurrent.weightparams(1);

    // Check forward weight matrices' sizes
    r = validateGeneralWeightParams(weightParamsF.inputgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "forward input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.forgetgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "forward forget gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.blockinputweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "forward block input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.outputgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "forward output gate weight matrix");
    if(!r.good()) return r;
    // Check forward recursion matrices' sizes
    r = validateGeneralWeightParams(weightParamsF.inputgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "forward input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.forgetgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "forward forget gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.blockinputrecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "forward block input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.outputgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "forward output gate recursion matrix");
    if(!r.good()) return r;
    // Check backward weight matrices' sizes
    r = validateGeneralWeightParams(weightParamsB.inputgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "backward input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.forgetgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "backward forget gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.blockinputweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "backward block input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.outputgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "backward output gate weight matrix");
    if(!r.good()) return r;
    // Check backward recursion matrices' sizes
    r = validateGeneralWeightParams(weightParamsB.inputgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "backward input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.forgetgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "backward forget gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.blockinputrecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "backward block input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.outputgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "backward output gate recursion matrix");
    if(!r.good()) return r;

    // Check bias vectors
    if (recurrent.params().hasbiasvectors()) {
        r = validateGeneralWeightParams(weightParamsF.inputgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward input gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsF.forgetgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward forget gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsF.blockinputbiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward block input bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsF.outputgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward output gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.inputgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward input gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.forgetgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward forget gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.blockinputbiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward block input bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.outputgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward output gate bias vector");
        if(!r.good()) return r;
    }
    // Check peephole vectors
    if (recurrent.params().haspeepholevectors()){
        r = validateGeneralWeightParams(weightParamsF.inputgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward input gate peephole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsF.forgetgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward forget gate peephole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsF.outputgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward output gate peephole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.inputgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward input gate peephole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.forgetgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward forget gate peephole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.outputgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward output gate peephole vector");
        if(!r.good()) return r;
    }
    return r;
}